

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O3

Aig_MmFixed_t * Dar_ManComputeCuts(Aig_Man_t *pAig,int nCutsMax,int fSkipTtMin,int fVerbose)

{
  Aig_Obj_t *pObj;
  Aig_MmFixed_t *pAVar1;
  int iVar2;
  uint uVar3;
  Dar_Man_t *p;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int nCutsK;
  timespec ts_1;
  timespec ts;
  uint local_6c;
  timespec local_68;
  Dar_RwrPar_t local_58;
  
  iVar2 = clock_gettime(3,(timespec *)&local_58);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_58.fUpdateLevel,local_58.fFanout)),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) +
            CONCAT44(local_58.nSubgMax,local_58.nCutsMax) * -1000000;
  }
  Aig_ManCleanup(pAig);
  local_58.nSubgMax = 5;
  local_58.fFanout = 1;
  local_58.fUpdateLevel = 0;
  local_58.fUseZeros = 0;
  local_58.fPower = 0;
  local_58.fRecycle = 1;
  local_58.fVerbose = 0;
  local_58.fVeryVerbose = 0;
  local_58.nCutsMax = nCutsMax;
  p = Dar_ManStart(pAig,&local_58);
  Aig_MmFixedRestart(p->pMemCuts);
  Dar_ObjPrepareCuts(p,p->pAig->pConst1);
  pVVar4 = pAig->vCis;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      Dar_ObjPrepareCuts(p,(Aig_Obj_t *)pVVar4->pArray[lVar7]);
      lVar7 = lVar7 + 1;
      pVVar4 = pAig->vCis;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4 = pAig->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar4->pArray[lVar7];
      if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
        Dar_ObjComputeCuts(p,pObj,fSkipTtMin);
        pVVar4 = pAig->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  if (fVerbose != 0) {
    uVar3 = Dar_ManCutCount(pAig,(int *)&local_6c);
    printf("Nodes = %6d. Total cuts = %6d. 4-input cuts = %6d.\n",
           (ulong)(uint)(pVVar4->nSize - pAig->nDeleted),(ulong)uVar3,(ulong)local_6c);
    iVar2 = Aig_MmFixedReadMemUsage(p->pMemCuts);
    iVar6 = 0x8e3dba;
    printf("Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
           SUB84((double)iVar2 * 9.5367431640625e-07,0),0x18,4);
    Abc_Print(iVar6,"%s =","Runtime");
    iVar6 = 3;
    iVar2 = clock_gettime(3,&local_68);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%9.2f sec\n",SUB84((double)(lVar7 + lVar5) / 1000000.0,0));
  }
  pAVar1 = p->pMemCuts;
  p->pMemCuts = (Aig_MmFixed_t *)0x0;
  Dar_ManStop(p);
  return pAVar1;
}

Assistant:

Aig_MmFixed_t * Dar_ManComputeCuts( Aig_Man_t * pAig, int nCutsMax, int fSkipTtMin, int fVerbose )
{ 
    Dar_Man_t * p;
    Dar_RwrPar_t Pars, * pPars = &Pars; 
    Aig_Obj_t * pObj;
    Aig_MmFixed_t * pMemCuts;
    int i, nNodes;
    abctime clk = Abc_Clock();
    // remove dangling nodes
    if ( (nNodes = Aig_ManCleanup( pAig )) )
    {
//        printf( "Removing %d nodes.\n", nNodes );
    }
    // create default parameters
    Dar_ManDefaultRwrParams( pPars );
    pPars->nCutsMax = nCutsMax;
    // create rewriting manager
    p = Dar_ManStart( pAig, pPars );
    // set elementary cuts for the PIs
//    Dar_ManCutsStart( p );
    Aig_MmFixedRestart( p->pMemCuts );
    Dar_ObjPrepareCuts( p, Aig_ManConst1(p->pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Dar_ObjPrepareCuts( p, pObj );
    // compute cuts for each nodes in the topological order
    Aig_ManForEachNode( pAig, pObj, i )
        Dar_ObjComputeCuts( p, pObj, fSkipTtMin );
    // print verbose stats
    if ( fVerbose )
    {
//        Aig_Obj_t * pObj;
        int nCuts, nCutsK;//, i;
        nCuts = Dar_ManCutCount( pAig, &nCutsK );
        printf( "Nodes = %6d. Total cuts = %6d. 4-input cuts = %6d.\n",
            Aig_ManObjNum(pAig), nCuts, nCutsK );
        printf( "Cut size = %2d. Truth size = %2d. Total mem = %5.2f MB  ",
            (int)sizeof(Dar_Cut_t), (int)4, 1.0*Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) );
        ABC_PRT( "Runtime", Abc_Clock() - clk );
/*
        Aig_ManForEachNode( pAig, pObj, i )
            if ( i % 300 == 0 )
                Dar_ObjCutPrint( pAig, pObj );
*/
    }
    // free the cuts
    pMemCuts = p->pMemCuts;
    p->pMemCuts = NULL;
//    Dar_ManCutsFree( p );
    // stop the rewriting manager
    Dar_ManStop( p );
    return pMemCuts;
}